

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsRFC4380(CNetAddr *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  CNetAddr *in_stack_ffffffffffffffc8;
  bool local_19;
  undefined4 in_stack_fffffffffffffff0;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *obj;
  
  obj = *(prevector<16U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28);
  bVar1 = IsIPv6(in_stack_ffffffffffffffc8);
  local_19 = false;
  if (bVar1) {
    local_19 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,4ul>
                         (obj,(array<unsigned_char,_4UL> *)
                              (ulong)CONCAT15(1,CONCAT14(0x20,in_stack_fffffffffffffff0)));
  }
  if (*(prevector<16U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28) != obj) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool CNetAddr::IsRFC4380() const
{
    return IsIPv6() && HasPrefix(m_addr, std::array<uint8_t, 4>{0x20, 0x01, 0x00, 0x00});
}